

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O1

TypeID NULLCTypeInfo::TypeArgumentType(int argument,int *typeID)

{
  uint *puVar1;
  char *__function;
  long lVar2;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0xf8,"TypeID NULLCTypeInfo::TypeArgumentType(int, int *)");
  }
  if ((uint)*typeID < *(uint *)(linker + 0x20c)) {
    lVar2 = (ulong)(uint)*typeID * 0x50;
    puVar1 = (uint *)(*(long *)(linker + 0x200) + lVar2);
    if (*(int *)(*(long *)(linker + 0x200) + 0x10 + lVar2) == 3) {
      if ((uint)argument < puVar1[6]) {
        if (*(int *)(linker + 0x21c) != 0) {
          return (TypeID)*(uint *)(*(long *)(linker + 0x210) +
                                  (ulong)(puVar1[9] + argument + 1) * 0xc);
        }
        __function = 
        "T &FastVector<ExternMemberInfo>::operator[](unsigned int) [T = ExternMemberInfo, zeroNewMemory = false, skipConstructor = false]"
        ;
        goto LAB_001234db;
      }
      if (*puVar1 < *(uint *)(linker + 0x29c)) {
        nullcThrowError("typeid::argumentType: argument number illegal, function (%s) has only %d argument(s)"
                        ,(ulong)*puVar1 + *(long *)(linker + 0x290));
        return (TypeID)0;
      }
    }
    else if (*puVar1 < *(uint *)(linker + 0x29c)) {
      nullcThrowError("typeid::argumentType received type (%s) that is not a function",
                      (ulong)*puVar1 + *(long *)(linker + 0x290));
      return (TypeID)0;
    }
    __function = 
    "T &FastVector<char>::operator[](unsigned int) [T = char, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
  else {
    __function = 
    "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
    ;
  }
LAB_001234db:
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/../Array.h"
                ,0x7f,__function);
}

Assistant:

TypeID TypeArgumentType(int argument, int* typeID)
	{
		assert(linker);
		ExternTypeInfo &type = linker->exTypes[*typeID];
		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("typeid::argumentType received type (%s) that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}
		if((unsigned int)argument >= type.memberCount)
		{
			nullcThrowError("typeid::argumentType: argument number illegal, function (%s) has only %d argument(s)", &linker->exSymbols[type.offsetToName], type.memberCount);
			return getTypeID(0);
		}
		ExternMemberInfo *memberList = &linker->exTypeExtra[0];
		return getTypeID(memberList[type.memberOffset + argument + 1].type);
	}